

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::UpdateWindowParentAndRootLinks
               (ImGuiWindow *window,ImGuiWindowFlags flags,ImGuiWindow *parent_window)

{
  byte bVar1;
  ImGuiWindow *pIVar2;
  
  window->ParentWindow = parent_window;
  window->RootWindowForNav = window;
  window->RootWindowForTitleBarHighlight = window;
  window->RootWindow = window;
  if ((flags & 0x3000000U) == 0x1000000 && parent_window != (ImGuiWindow *)0x0) {
    window->RootWindow = parent_window->RootWindow;
  }
  if (((parent_window != (ImGuiWindow *)0x0) && ((flags & 0x8000000U) == 0)) &&
     ((flags & 0x5000000U) != 0)) {
    window->RootWindowForTitleBarHighlight = parent_window->RootWindowForTitleBarHighlight;
  }
  bVar1 = *(byte *)((long)&window->Flags + 2);
  pIVar2 = window;
  while( true ) {
    if ((bVar1 & 0x80) == 0) {
      return;
    }
    pIVar2 = pIVar2->ParentWindow;
    if (pIVar2 == (ImGuiWindow *)0x0) break;
    window->RootWindowForNav = pIVar2;
    bVar1 = *(byte *)((long)&pIVar2->Flags + 2);
  }
  __assert_fail("window->RootWindowForNav->ParentWindow != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                ,0x1655,
                "void ImGui::UpdateWindowParentAndRootLinks(ImGuiWindow *, ImGuiWindowFlags, ImGuiWindow *)"
               );
}

Assistant:

void ImGui::UpdateWindowParentAndRootLinks(ImGuiWindow* window, ImGuiWindowFlags flags, ImGuiWindow* parent_window)
{
    window->ParentWindow = parent_window;
    window->RootWindow = window->RootWindowForTitleBarHighlight = window->RootWindowForNav = window;
    if (parent_window && (flags & ImGuiWindowFlags_ChildWindow) && !(flags & ImGuiWindowFlags_Tooltip))
        window->RootWindow = parent_window->RootWindow;
    if (parent_window && !(flags & ImGuiWindowFlags_Modal) && (flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_Popup)))
        window->RootWindowForTitleBarHighlight = parent_window->RootWindowForTitleBarHighlight;
    while (window->RootWindowForNav->Flags & ImGuiWindowFlags_NavFlattened)
    {
        IM_ASSERT(window->RootWindowForNav->ParentWindow != NULL);
        window->RootWindowForNav = window->RootWindowForNav->ParentWindow;
    }
}